

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void outchar_noxlat_stream(out_stream_info *stream,char c)

{
  ushort *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  mcmcxdef *cctx;
  ushort **ppuVar5;
  __int32_t **pp_Var6;
  uchar *puVar7;
  size_t sVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char cVar13;
  uchar uVar14;
  int iVar15;
  ulong uVar16;
  char *__s;
  bool bVar17;
  char tmpbuf [2048];
  int tmpattr [2048];
  undefined1 local_2838 [2048];
  undefined1 local_2038 [8200];
  
  uVar16 = 0x20;
  if (((c != '\x1a') && (uVar16 = 9, c != '\x19')) && (uVar16 = (ulong)(byte)c, -1 < c)) {
    ppuVar5 = __ctype_b_loc();
    uVar16 = 0x20;
    if ((*(byte *)((long)*ppuVar5 + (ulong)(byte)c * 2 + 1) & 0x20) == 0) {
      uVar16 = (ulong)(byte)c;
    }
  }
  cVar13 = (char)uVar16;
  if (((stream->capsflag != '\0') || (stream->allcapsflag != '\0')) && (-1 < cVar13)) {
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[uVar16] >> 10 & 1) != 0) {
      if ((-1 < cVar13) && (((*ppuVar5)[uVar16] & 0x200) != 0)) {
        pp_Var6 = __ctype_toupper_loc();
        uVar16 = (ulong)*(byte *)(*pp_Var6 + uVar16);
      }
      stream->capsflag = '\0';
      goto LAB_0021df3a;
    }
  }
  if ((stream->nocapsflag != '\0') && (-1 < cVar13)) {
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[uVar16] >> 10 & 1) != 0) {
      if (((*ppuVar5)[uVar16] >> 8 & 1) != 0) {
        pp_Var6 = __ctype_tolower_loc();
        uVar16 = (ulong)*(byte *)(*pp_Var6 + uVar16);
      }
      stream->nocapsflag = '\0';
    }
  }
LAB_0021df3a:
  uVar14 = (uchar)uVar16;
  if (stream->capturing == 0) {
    bVar2 = stream->linecol;
    if ((int)(bVar2 + 1) < G_os_linewidth) {
      if (-1 < (char)uVar14) {
        ppuVar5 = __ctype_b_loc();
        bVar17 = (*(byte *)((long)*ppuVar5 + uVar16 * 2 + 1) & 0x20) != 0;
        if ((((c != '\x1a') && (bVar2 == 0)) && (uVar14 != '\t' && bVar17)) &&
           (stream->html_pre_level == 0)) {
          return;
        }
        if (((bVar2 != 0 && c != '\x1a') && (uVar14 != '\t' && bVar17)) &&
           (stream->html_pre_level == 0)) {
          bVar3 = stream->linepos;
          uVar16 = (ulong)bVar3;
          bVar9 = stream->linebuf[uVar16 - 1];
          uVar11 = (ulong)(char)bVar9;
          if ((-1 < (long)uVar11) && ((*(byte *)((long)*ppuVar5 + uVar11 * 2 + 1) & 0x20) != 0)) {
            return;
          }
          if (doublespace != 0) {
            uVar12 = uVar16;
            if (bVar3 != 1) {
              do {
                uVar10 = (uint)uVar11 & 0xff;
                if (uVar10 < 0x3f) {
                  switch(uVar10) {
                  case 0x21:
                    goto switchD_0021e109_caseD_21;
                  case 0x22:
                  case 0x27:
                  case 0x29:
                    goto switchD_0021e109_caseD_22;
                  case 0x23:
                  case 0x24:
                  case 0x25:
                  case 0x26:
                  case 0x28:
                    goto switchD_0021e109_caseD_23;
                  default:
                    if ((uVar10 == 0x2e) || (uVar10 == 0x3a)) goto switchD_0021e109_caseD_21;
                    goto switchD_0021e109_caseD_23;
                  }
                }
                if ((uVar10 != 0x5d) && (uVar10 != 0x7d)) {
                  if (uVar10 == 0x3f) goto switchD_0021e109_caseD_21;
                  goto switchD_0021e109_caseD_23;
                }
switchD_0021e109_caseD_22:
                bVar9 = stream->linebuf[uVar12 - 2];
                uVar11 = (ulong)bVar9;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 1);
            }
            if ((bVar9 < 0x40) && ((0x8400400200000000U >> ((ulong)bVar9 & 0x3f) & 1) != 0)) {
switchD_0021e109_caseD_21:
              stream->attrbuf[uVar16] = stream->cur_attr;
              stream->linepos = bVar3 + 1;
              stream->linebuf[uVar16] = uVar14;
              stream->linecol = bVar2 + 1;
            }
          }
        }
      }
    }
    else {
      if ((((-1 < (char)uVar14) && (ppuVar5 = __ctype_b_loc(), c != '\x1a')) &&
          (((*ppuVar5)[uVar16] & 0x2000) != 0)) && (uVar14 != '\t')) {
        bVar2 = stream->linepos;
        if (stream->linebuf[(ulong)bVar2 - 1] == ' ') {
          return;
        }
        stream->attrbuf[bVar2] = stream->cur_attr;
        stream->linepos = bVar2 + 1;
        stream->linebuf[bVar2] = ' ';
        return;
      }
      bVar2 = stream->linepos;
      uVar16 = (ulong)(bVar2 - 1);
      if (uVar14 == '-') {
        uVar11 = (ulong)bVar2;
        if (bVar2 != 0) {
          do {
            iVar15 = (int)uVar11;
            uVar16 = (ulong)(iVar15 - 1);
            if (stream->linebuf[uVar16] != '-') goto LAB_0021e1eb;
            uVar11 = (ulong)(iVar15 - 1U);
          } while (iVar15 - 1U != 0 && 0 < iVar15);
          uVar16 = 0xffffffff;
        }
LAB_0021e1eb:
        if (-1 < (int)uVar16) {
          do {
            iVar15 = (int)uVar16;
            cVar13 = stream->linebuf[uVar16];
            if (((long)cVar13 < 0) ||
               (ppuVar5 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar5 + (long)cVar13 * 2 + 1) & 0x20) == 0)) goto LAB_0021e220;
            uVar16 = (ulong)(iVar15 - 1);
          } while (0 < iVar15);
        }
        uVar16 = 0xffffffff;
      }
LAB_0021e220:
      uVar10 = (uint)uVar16;
      if (-1 < (int)uVar10) {
        do {
          uVar10 = (uint)uVar16;
          cVar13 = stream->linebuf[uVar16];
          if (((-1 < (long)cVar13) &&
              (ppuVar5 = __ctype_b_loc(),
              (*(byte *)((long)*ppuVar5 + (long)cVar13 * 2 + 1) & 0x20) != 0)) ||
             ((cVar13 == '-' && (stream->os_line_wrap == 0)))) goto LAB_0021e264;
          uVar16 = (ulong)(uVar10 - 1);
        } while (0 < (int)uVar10);
        uVar10 = 0xffffffff;
      }
LAB_0021e264:
      if ((int)uVar10 < 0) {
        out_flushline(stream,0);
        stream->linepos = '\0';
        stream->linecol = '\0';
        stream->linebuf[0] = '\0';
      }
      else {
        __s = stream->linebuf + (ulong)uVar10 + 1;
        cVar13 = stream->linebuf[uVar10];
        stream->linebuf[bVar2] = '\0';
        sVar8 = strlen(__s);
        memcpy(local_2838,__s,sVar8 + 1);
        memcpy(local_2038,stream->attrbuf + (ulong)uVar10 + 1,sVar8 * 4);
        if ((-1 < (long)cVar13) &&
           (ppuVar5 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar5 + (long)cVar13 * 2 + 1) & 0x20) != 0)) {
          __s = stream->linebuf + uVar10;
        }
        *__s = '\0';
        out_flushline(stream,1);
        memcpy(stream->linebuf,local_2838,sVar8 + 1);
        memcpy(stream->attrbuf,local_2038,sVar8 * 4);
        stream->linepos = (uchar)sVar8;
        stream->linecol = '\0';
        if ((uchar)sVar8 != '\0') {
          uVar16 = 0;
          do {
            if (0x19 < (byte)stream->linebuf[uVar16]) {
              stream->linecol = stream->linecol + '\x01';
            }
            uVar16 = uVar16 + 1;
          } while ((sVar8 & 0xff) != uVar16);
        }
      }
    }
switchD_0021e109_caseD_23:
    bVar2 = stream->linepos;
    stream->attrbuf[bVar2] = stream->cur_attr;
    stream->linepos = bVar2 + 1;
    stream->linebuf[bVar2] = uVar14;
    stream->linecol = stream->linecol + '\x01';
  }
  else if (stream->capture_obj != 0xffff) {
    puVar7 = mcmlck(stream->capture_ctx,stream->capture_obj);
    cctx = stream->capture_ctx;
    uVar4 = stream->capture_obj;
    if ((uint)*(ushort *)
               ((long)&cctx->mcmcxgl->mcmcxtab[cctx->mcmcxmtb[uVar4 >> 8][uVar4 & 0xff] >> 8]->
                       mcmosiz + (ulong)((cctx->mcmcxmtb[uVar4 >> 8][uVar4 & 0xff] & 0xff) << 5)) <=
        stream->capture_ofs) {
      puVar7 = mcmrealo(cctx,uVar4,(short)stream->capture_ofs + 0x100);
    }
    uVar10 = stream->capture_ofs;
    stream->capture_ofs = uVar10 + 1;
    puVar7[uVar10] = uVar14;
    uVar4 = stream->capture_ctx->mcmcxmtb[stream->capture_obj >> 8][stream->capture_obj & 0xff];
    puVar1 = (ushort *)
             ((long)&stream->capture_ctx->mcmcxgl->mcmcxtab[uVar4 >> 8]->mcmoflg +
             (ulong)((uVar4 & 0xff) << 5));
    *puVar1 = *puVar1 | 1;
    mcmunlck(stream->capture_ctx,stream->capture_obj);
    return;
  }
  return;
}

Assistant:

static void outchar_noxlat_stream(out_stream_info *stream, char c)
{
    int  i;
    int  qspace;
    
    /* check for the special quoted space character */
    if (c == QSPACE)
    {
        /* it's a quoted space - note it and convert it to a regular space */
        qspace = 1;
        c = ' ';
    }
    else if (c == QTAB)
    {
        /* it's a hard tab - convert it to an ordinary tab */
        c = '\t';
        qspace = 0;
    }
    else
    {
        /* translate any whitespace character to a regular space character */
        if (outissp(c))
            c = ' ';
        
        /* it's not a quoted space */
        qspace = 0;
    }

    /* check for the caps/nocaps flags */
    if ((stream->capsflag || stream->allcapsflag) && outisal(c))
    {
        /* capsflag is set, so capitalize this character */
        if (outislo(c))
            c = toupper(c);

        /* okay, we've capitalized something; clear flag */
        stream->capsflag = 0;
    }
    else if (stream->nocapsflag && outisal(c))
    {
        /* nocapsflag is set, so minisculize this character */
        if (outisup(c))
            c = tolower(c);

        /* clear the flag now that we've done the job */
        stream->nocapsflag = 0;
    }

    /* if in capture mode, simply capture the character */
    if (stream->capturing)
    {
        uchar *p;

        /* if we have a valid capture object, copy to it */
        if (stream->capture_obj != MCMONINV)
        {
            /* lock the object holding the captured text */
            p = mcmlck(stream->capture_ctx, stream->capture_obj);
            
            /* make sure the capture object is big enough */
            if (mcmobjsiz(stream->capture_ctx, stream->capture_obj)
                <= stream->capture_ofs)
            {
                /* expand the object by another 256 bytes */
                p = mcmrealo(stream->capture_ctx, stream->capture_obj,
                             (ushort)(stream->capture_ofs + 256));
            }
            
            /* add this character */
            *(p + stream->capture_ofs++) = c;
            
            /* unlock the capture object */
            mcmtch(stream->capture_ctx, stream->capture_obj);
            mcmunlck(stream->capture_ctx, stream->capture_obj);
        }

        /*
         *   we're done - we don't want to actually display the character
         *   while capturing 
         */
        return;
    }

    /* add the character to out output buffer, flushing as needed */
    if (stream->linecol + 1 < G_os_linewidth)
    {
        /* 
         *   there's room for this character, so add it to the buffer 
         */
        
        /* ignore non-quoted space at start of line outside of PRE */
        if (outissp(c) && c != '\t' && stream->linecol == 0 && !qspace
            && stream->html_pre_level == 0)
            return;

        /* is this a non-quoted space not at the start of the line? */
        if (outissp(c) && c != '\t' && stream->linecol != 0 && !qspace
            && stream->html_pre_level == 0)
        {
            int  pos1 = stream->linepos - 1;
            char p = stream->linebuf[pos1];     /* check previous character */

            /* ignore repeated spaces - collapse into a single space */
            if (outissp(p))
                return;

            /*
             *   Certain punctuation requires a double space: a period, a
             *   question mark, an exclamation mark, or a colon; or any of
             *   these characters followed by any number of single and/or
             *   double quotes.  First, scan back to before any quotes, if
             *   are on one now, then check the preceding character; if
             *   it's one of the punctuation marks requiring a double
             *   space, add this space a second time.  (In addition to
             *   scanning back past quotes, scan past parentheses,
             *   brackets, and braces.)  Don't double the spacing if we're
             *   not in the normal doublespace mode; some people may
             *   prefer single spacing after punctuation, so we make this
             *   a run-time option.  
             */
            if (doublespace)
            {
                /* find the previous relevant punctuation character */
                while (pos1 &&
                       (p == '"' || p == '\'' || p == ')' || p == ']'
                        || p == '}'))
                {
                    p = stream->linebuf[--pos1];
                }
                if ( p == '.' || p == '?' || p == '!' || p == ':' )
                {
                    /* a double-space is required after this character */
                    stream->attrbuf[stream->linepos] = stream->cur_attr;
                    stream->linebuf[stream->linepos++] = c;
                    ++(stream->linecol);
                }
            }
        }

        /* add this character to the buffer */
        stream->attrbuf[stream->linepos] = stream->cur_attr;
        stream->linebuf[stream->linepos++] = c;

        /* advance the output column position */
        ++(stream->linecol);
        return;
    }

    /*
     *   The line would overflow if this character were added.  Find the
     *   most recent word break, and output the line up to the previous
     *   word.  Note that if we're trying to output a space, we'll just
     *   add it to the line buffer.  If the last character of the line
     *   buffer is already a space, we won't do anything right now.  
     */
    if (outissp(c) && c != '\t' && !qspace)
    {
        /* this is a space, so we're at a word break */
        if (stream->linebuf[stream->linepos - 1] != ' ')
        {
            stream->attrbuf[stream->linepos] = stream->cur_attr;
            stream->linebuf[stream->linepos++] = ' ';
        }
        return;
    }
    
    /*
     *   Find the most recent word break: look for a space or dash, starting
     *   at the end of the line.  
     *   
     *   If we're about to write a hyphen, we want to skip all contiguous
     *   hyphens, because we want to keep them together as a single
     *   punctuation mark; then keep going in the normal manner, which will
     *   keep the hyphens plus the word they're attached to together as a
     *   single unit.  If spaces precede the sequence of hyphens, include
     *   the prior word as well.  
     */
    i = stream->linepos - 1;
    if (c == '-')
    {
        /* skip any contiguous hyphens at the end of the line */
        for ( ; i >= 0 && stream->linebuf[i] == '-' ; --i) ;
        
        /* skip any spaces preceding the sequence of hyphens */
        for ( ; i >= 0 && outissp(stream->linebuf[i]) ; --i) ;
    }

    /* 
     *   Now find the preceding space.  If we're doing our own wrapping
     *   (i.e., we're not using OS line wrapping), then look for the
     *   nearest hyphen as well. 
     */
    for ( ; i >= 0 && !outissp(stream->linebuf[i])
          && !(!stream->os_line_wrap && stream->linebuf[i] == '-') ; --i) ;

    /* check to see if we found a good place to break */
    if (i < 0)
    {
        /* 
         *   we didn't find any good place to break - flush the entire
         *   line as-is, breaking arbitrarily in the middle of a word 
         */
        out_flushline(stream, FALSE);

        /* 
         *   we've completely cleared out the line buffer, so reset all of
         *   the line buffer counters 
         */
        stream->linepos = 0;
        stream->linecol = 0;
        stream->linebuf[0] = '\0';
    }
    else
    {
        char brkchar;
        char tmpbuf[MAXWIDTH];
        int tmpattr[MAXWIDTH];
        size_t tmpcnt;

        /* remember the word-break character */        
        brkchar = stream->linebuf[i];

        /* null-terminate the line buffer */        
        stream->linebuf[stream->linepos] = '\0';

        /* the next line starts after the break - save a copy */
        tmpcnt = strlen(&stream->linebuf[i+1]);
        memcpy(tmpbuf, &stream->linebuf[i+1], tmpcnt + 1);
        memcpy(tmpattr, &stream->attrbuf[i+1], tmpcnt * sizeof(tmpattr[0]));

        /* 
         *   terminate the buffer at the space or after the hyphen,
         *   depending on where we broke 
         */
        if (outissp(brkchar))
            stream->linebuf[i] = '\0';
        else
            stream->linebuf[i+1] = '\0';

        /* write out everything up to the word break */
        out_flushline(stream, TRUE);

        /* copy the next line into line buffer */
        memcpy(stream->linebuf, tmpbuf, tmpcnt + 1);
        memcpy(stream->attrbuf, tmpattr, tmpcnt * sizeof(tmpattr[0]));
        stream->linepos = tmpcnt;

        /* 
         *   figure what column we're now in - count all of the printable
         *   characters in the new line 
         */
        for (stream->linecol = 0, i = 0 ; i < stream->linepos ; ++i)
        {
            /* if it's printable, count it */
            if (((unsigned char)stream->linebuf[i]) >= 26)
                ++(stream->linecol);
        }
    }
    
    /* add the new character to buffer */
    stream->attrbuf[stream->linepos] = stream->cur_attr;
    stream->linebuf[stream->linepos++] = c;

    /* advance the column counter */
    ++(stream->linecol);
}